

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

void DoDamage(AActor *dmgtarget,AActor *inflictor,AActor *source,int amount,FName *DamageType,
             int flags,PClassActor *filter,FName *species)

{
  PClassActor *pPVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  byte bVar4;
  bool bVar5;
  undefined1 local_5c [36];
  DAngle local_38;
  
  local_5c._4_8_ = DamageType;
  local_5c._12_8_ = inflictor;
  local_5c._20_8_ = source;
  if ((dmgtarget->super_DThinker).super_DObject.Class == (PClass *)0x0) {
    iVar2 = (**(dmgtarget->super_DThinker).super_DObject._vptr_DObject)(dmgtarget);
    (dmgtarget->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar2);
  }
  pPVar1 = (PClassActor *)(dmgtarget->super_DThinker).super_DObject.Class;
  iVar2 = species->Index;
  AActor::GetSpecies((AActor *)local_5c);
  if (iVar2 == 0) {
    bVar5 = true;
  }
  else if ((char)flags < '\0') {
    bVar5 = local_5c._0_4_ != iVar2;
  }
  else {
    bVar5 = local_5c._0_4_ == iVar2;
  }
  bVar4 = filter == (PClassActor *)0x0 | pPVar1 == filter ^ (byte)((flags & 0x40U) >> 6);
  if (((uint)flags >> 8 & 1) == 0) {
    if ((bVar4 & bVar5) != 1) {
      return;
    }
  }
  else if (bVar4 == 0 && bVar5 == false) {
    return;
  }
  iVar2 = (flags & 1U) * 0x40;
  uVar3 = iVar2 + 0x10 + (flags & 0x10U) * 8;
  if ((flags & 0xcU) == 0) {
    uVar3 = iVar2 + (flags & 0x10U) * 8;
  }
  if ((flags & 4U) != 0) {
    amount = amount + dmgtarget->health;
  }
  if (amount < 1) {
    if (amount < 0) {
      P_GiveBody(dmgtarget,-amount,0);
    }
  }
  else {
    if (((uint)flags >> 9 & 1) != 0) {
      *(int *)local_5c._4_8_ = (((FNameNoInit *)(local_5c._12_8_ + 0x404))->super_FName).Index;
    }
    local_5c._32_4_ = *(int *)local_5c._4_8_;
    local_38.Degrees = 0.0;
    P_DamageMobj(dmgtarget,(AActor *)local_5c._12_8_,(AActor *)local_5c._20_8_,amount,
                 (FName *)(local_5c + 0x20),(uint)((flags & 6U) != 2) + (flags & 0x20U) * 8 | uVar3,
                 &local_38);
  }
  return;
}

Assistant:

static void DoDamage(AActor *dmgtarget, AActor *inflictor, AActor *source, int amount, FName DamageType, int flags, PClassActor *filter, FName species)
{
	bool filterpass = DoCheckClass(dmgtarget, filter, !!(flags & DMSS_EXFILTER)),
		speciespass = DoCheckSpecies(dmgtarget, species, !!(flags & DMSS_EXSPECIES));
	if ((flags & DMSS_EITHER) ? (filterpass || speciespass) : (filterpass && speciespass))
	{
		int dmgFlags = 0;
		if (flags & DMSS_FOILINVUL)
			dmgFlags |= DMG_FOILINVUL;
		if (flags & DMSS_FOILBUDDHA)
			dmgFlags |= DMG_FOILBUDDHA;
		if (flags & (DMSS_KILL | DMSS_NOFACTOR)) //Kill implies NoFactor
			dmgFlags |= DMG_NO_FACTOR;
		if (!(flags & DMSS_AFFECTARMOR) || (flags & DMSS_KILL)) //Kill overrides AffectArmor
			dmgFlags |= DMG_NO_ARMOR;
		if (flags & DMSS_KILL) //Kill adds the value of the damage done to it. Allows for more controlled extreme death types.
			amount += dmgtarget->health;
		if (flags & DMSS_NOPROTECT) //Ignore PowerProtection.
			dmgFlags |= DMG_NO_PROTECT;
	
		if (amount > 0)
		{ //Should wind up passing them through just fine.
			if (flags & DMSS_INFLICTORDMGTYPE)
				DamageType = inflictor->DamageType;

			P_DamageMobj(dmgtarget, inflictor, source, amount, DamageType, dmgFlags);
		}
		else if (amount < 0)
		{
			amount = -amount;
			P_GiveBody(dmgtarget, amount);
		}
	}
}